

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O0

int aes_encrypt_key256(uchar *key,aes_encrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t ss [8];
  aes_encrypt_ctx *cx_local;
  uchar *key_local;
  
  uVar5 = (uint)key[3] << 0x18 | (uint)key[2] << 0x10 | (uint)key[1] << 8 | (uint)*key;
  cx->ks[0] = uVar5;
  uVar6 = (uint)key[7] << 0x18 | (uint)key[6] << 0x10 | (uint)key[5] << 8 | (uint)key[4];
  cx->ks[1] = uVar6;
  uVar7 = (uint)key[0xb] << 0x18 | (uint)key[10] << 0x10 | (uint)key[9] << 8 | (uint)key[8];
  cx->ks[2] = uVar7;
  uVar8 = (uint)key[0xf] << 0x18 | (uint)key[0xe] << 0x10 | (uint)key[0xd] << 8 | (uint)key[0xc];
  cx->ks[3] = uVar8;
  uVar9 = (uint)key[0x13] << 0x18 | (uint)key[0x12] << 0x10 | (uint)key[0x11] << 8 | (uint)key[0x10]
  ;
  cx->ks[4] = uVar9;
  uVar10 = (uint)key[0x17] << 0x18 | (uint)key[0x16] << 0x10 | (uint)key[0x15] << 8 |
           (uint)key[0x14];
  cx->ks[5] = uVar10;
  uVar11 = (uint)key[0x1b] << 0x18 | (uint)key[0x1a] << 0x10 | (uint)key[0x19] << 8 |
           (uint)key[0x18];
  cx->ks[6] = uVar11;
  bVar1 = key[0x1f];
  bVar2 = key[0x1e];
  bVar3 = key[0x1d];
  bVar4 = key[0x1c];
  uVar12 = (uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4;
  cx->ks[7] = uVar12;
  uVar5 = t_fl[0][(uint)bVar3] ^ t_fl[1][(uint)bVar2] ^ t_fl[2][(uint)bVar1] ^ t_fl[3][(uint)bVar4]
          ^ 1 ^ uVar5;
  cx->ks[8] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[9] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[10] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0xb] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0xc] = uVar9;
  uVar10 = uVar9 ^ uVar10;
  cx->ks[0xd] = uVar10;
  uVar11 = uVar10 ^ uVar11;
  cx->ks[0xe] = uVar11;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0xf] = uVar12;
  uVar5 = t_fl[0][uVar12 >> 8 & 0xff] ^ t_fl[1][uVar12 >> 0x10 & 0xff] ^ t_fl[2][uVar12 >> 0x18] ^
          t_fl[3][uVar12 & 0xff] ^ 2 ^ uVar5;
  cx->ks[0x10] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[0x11] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[0x12] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0x13] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0x14] = uVar9;
  uVar10 = uVar9 ^ uVar10;
  cx->ks[0x15] = uVar10;
  uVar11 = uVar10 ^ uVar11;
  cx->ks[0x16] = uVar11;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x17] = uVar12;
  uVar5 = t_fl[0][uVar12 >> 8 & 0xff] ^ t_fl[1][uVar12 >> 0x10 & 0xff] ^ t_fl[2][uVar12 >> 0x18] ^
          t_fl[3][uVar12 & 0xff] ^ 4 ^ uVar5;
  cx->ks[0x18] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[0x19] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[0x1a] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0x1b] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0x1c] = uVar9;
  uVar10 = uVar9 ^ uVar10;
  cx->ks[0x1d] = uVar10;
  uVar11 = uVar10 ^ uVar11;
  cx->ks[0x1e] = uVar11;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x1f] = uVar12;
  uVar5 = t_fl[0][uVar12 >> 8 & 0xff] ^ t_fl[1][uVar12 >> 0x10 & 0xff] ^ t_fl[2][uVar12 >> 0x18] ^
          t_fl[3][uVar12 & 0xff] ^ 8 ^ uVar5;
  cx->ks[0x20] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[0x21] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[0x22] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0x23] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0x24] = uVar9;
  uVar10 = uVar9 ^ uVar10;
  cx->ks[0x25] = uVar10;
  uVar11 = uVar10 ^ uVar11;
  cx->ks[0x26] = uVar11;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x27] = uVar12;
  uVar5 = t_fl[0][uVar12 >> 8 & 0xff] ^ t_fl[1][uVar12 >> 0x10 & 0xff] ^ t_fl[2][uVar12 >> 0x18] ^
          t_fl[3][uVar12 & 0xff] ^ 0x10 ^ uVar5;
  cx->ks[0x28] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[0x29] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[0x2a] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0x2b] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0x2c] = uVar9;
  uVar10 = uVar9 ^ uVar10;
  cx->ks[0x2d] = uVar10;
  uVar11 = uVar10 ^ uVar11;
  cx->ks[0x2e] = uVar11;
  uVar12 = uVar11 ^ uVar12;
  cx->ks[0x2f] = uVar12;
  uVar5 = t_fl[0][uVar12 >> 8 & 0xff] ^ t_fl[1][uVar12 >> 0x10 & 0xff] ^ t_fl[2][uVar12 >> 0x18] ^
          t_fl[3][uVar12 & 0xff] ^ 0x20 ^ uVar5;
  cx->ks[0x30] = uVar5;
  uVar6 = uVar5 ^ uVar6;
  cx->ks[0x31] = uVar6;
  uVar7 = uVar6 ^ uVar7;
  cx->ks[0x32] = uVar7;
  uVar8 = uVar7 ^ uVar8;
  cx->ks[0x33] = uVar8;
  uVar9 = t_fl[0][uVar8 & 0xff] ^ t_fl[1][uVar8 >> 8 & 0xff] ^ t_fl[2][uVar8 >> 0x10 & 0xff] ^
          t_fl[3][uVar8 >> 0x18] ^ uVar9;
  cx->ks[0x34] = uVar9;
  uVar9 = uVar9 ^ uVar10;
  cx->ks[0x35] = uVar9;
  uVar9 = uVar9 ^ uVar11;
  cx->ks[0x36] = uVar9;
  uVar9 = uVar9 ^ uVar12;
  cx->ks[0x37] = uVar9;
  uVar5 = t_fl[0][uVar9 >> 8 & 0xff] ^ t_fl[1][uVar9 >> 0x10 & 0xff] ^ t_fl[2][uVar9 >> 0x18] ^
          t_fl[3][uVar9 & 0xff] ^ 0x40 ^ uVar5;
  cx->ks[0x38] = uVar5;
  uVar5 = uVar5 ^ uVar6;
  cx->ks[0x39] = uVar5;
  uVar5 = uVar5 ^ uVar7;
  cx->ks[0x3a] = uVar5;
  cx->ks[0x3b] = uVar5 ^ uVar8;
  (cx->inf).l = 0;
  (cx->inf).b[0] = 0xe0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(encrypt_key256)(const unsigned char *key, aes_encrypt_ctx cx[1])
{   uint32_t    ss[8];

    cx->ks[0] = ss[0] = word_in(key, 0);
    cx->ks[1] = ss[1] = word_in(key, 1);
    cx->ks[2] = ss[2] = word_in(key, 2);
    cx->ks[3] = ss[3] = word_in(key, 3);
    cx->ks[4] = ss[4] = word_in(key, 4);
    cx->ks[5] = ss[5] = word_in(key, 5);
    cx->ks[6] = ss[6] = word_in(key, 6);
    cx->ks[7] = ss[7] = word_in(key, 7);

#ifdef ENC_KS_UNROLL
    ke8(cx->ks, 0); ke8(cx->ks, 1);
    ke8(cx->ks, 2); ke8(cx->ks, 3);
    ke8(cx->ks, 4); ke8(cx->ks, 5);
#else
    {   uint32_t i;
        for(i = 0; i < 6; ++i)
            ke8(cx->ks,  i);
    }
#endif
    kef8(cx->ks, 6);
    cx->inf.l = 0;
    cx->inf.b[0] = 14 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}